

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

bool __thiscall Kernel::Clause::isPropositional(Clause *this)

{
  bool bVar1;
  Clause *in_stack_fffffffffffffff0;
  
  iterLits(in_stack_fffffffffffffff0);
  bVar1 = Lib::
          IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>
          ::all<Kernel::Clause::isPropositional()::__0>
                    ((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
                      *)&stack0xffffffffffffffe0);
  return bVar1;
}

Assistant:

bool Clause::isPropositional()
{
  return iterLits().all([](auto l) { return l->arity() == 0; });
}